

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O1

Vector3d * ear::toCartesianVector3d(Vector3d *__return_storage_ptr__,PolarSpeakerPosition *position)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = position->elevation;
  dVar1 = position->distance;
  dVar6 = position->azimuth * -0.017453292519943295;
  dVar2 = sin(dVar6);
  dVar3 = dVar3 * 0.017453292519943295;
  dVar4 = cos(dVar3);
  dVar6 = cos(dVar6);
  dVar5 = cos(dVar3);
  dVar3 = sin(dVar3);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = dVar4 * dVar2 * dVar1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar5 * dVar6 * dVar1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar3 * dVar1;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d toCartesianVector3d(PolarSpeakerPosition position) {
    return cart(position.azimuth, position.elevation, position.distance);
  }